

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

void u_versionToString_63(uint8_t *versionArray,char *versionString)

{
  char *pcVar1;
  bool bVar2;
  byte local_1d;
  ushort local_1c;
  ushort local_1a;
  uint8_t field;
  uint16_t part;
  char *pcStack_18;
  uint16_t count;
  char *versionString_local;
  uint8_t *versionArray_local;
  
  if (versionString != (char *)0x0) {
    if (versionArray == (uint8_t *)0x0) {
      *versionString = '\0';
    }
    else {
      local_1a = 4;
      while( true ) {
        bVar2 = false;
        if (local_1a != 0) {
          bVar2 = versionArray[(int)(local_1a - 1)] == '\0';
        }
        if (!bVar2) break;
        local_1a = local_1a - 1;
      }
      if (local_1a < 2) {
        local_1a = 2;
      }
      local_1d = *versionArray;
      pcStack_18 = versionString;
      if (99 < local_1d) {
        pcStack_18 = versionString + 1;
        *versionString = local_1d / 100 + 0x30;
        local_1d = local_1d % 100;
      }
      if (9 < local_1d) {
        *pcStack_18 = local_1d / 10 + 0x30;
        local_1d = local_1d % 10;
        pcStack_18 = pcStack_18 + 1;
      }
      *pcStack_18 = local_1d + 0x30;
      pcVar1 = pcStack_18;
      for (local_1c = 1; pcStack_18 = pcVar1 + 1, local_1c < local_1a; local_1c = local_1c + 1) {
        *pcStack_18 = '.';
        local_1d = versionArray[local_1c];
        pcStack_18 = pcVar1 + 2;
        if (99 < local_1d) {
          pcStack_18 = pcVar1 + 3;
          pcVar1[2] = local_1d / 100 + 0x30;
          local_1d = local_1d % 100;
        }
        if (9 < local_1d) {
          *pcStack_18 = local_1d / 10 + 0x30;
          local_1d = local_1d % 10;
          pcStack_18 = pcStack_18 + 1;
        }
        *pcStack_18 = local_1d + 0x30;
        pcVar1 = pcStack_18;
      }
      *pcStack_18 = '\0';
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_versionToString(const UVersionInfo versionArray, char *versionString) {
    uint16_t count, part;
    uint8_t field;

    if(versionString==NULL) {
        return;
    }

    if(versionArray==NULL) {
        versionString[0]=0;
        return;
    }

    /* count how many fields need to be written */
    for(count=4; count>0 && versionArray[count-1]==0; --count) {
    }

    if(count <= 1) {
        count = 2;
    }

    /* write the first part */
    /* write the decimal field value */
    field=versionArray[0];
    if(field>=100) {
        *versionString++=(char)('0'+field/100);
        field%=100;
    }
    if(field>=10) {
        *versionString++=(char)('0'+field/10);
        field%=10;
    }
    *versionString++=(char)('0'+field);

    /* write the following parts */
    for(part=1; part<count; ++part) {
        /* write a dot first */
        *versionString++=U_VERSION_DELIMITER;

        /* write the decimal field value */
        field=versionArray[part];
        if(field>=100) {
            *versionString++=(char)('0'+field/100);
            field%=100;
        }
        if(field>=10) {
            *versionString++=(char)('0'+field/10);
            field%=10;
        }
        *versionString++=(char)('0'+field);
    }

    /* NUL-terminate */
    *versionString=0;
}